

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O3

int Abc_CommandRunTest(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  char *pcVar2;
  uint fVerbose;
  uint fFancy;
  char *pcVar3;
  char *pFileNames [4];
  char *local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  local_38 = 0;
  uStack_30 = 0;
  local_48 = (char *)0x0;
  uStack_40 = 0;
  fFancy = 0;
  Extra_UtilGetoptReset();
  fVerbose = 0;
  while( true ) {
    while (iVar1 = Extra_UtilGetopt(argc,argv,"fvh"), iVar1 == 0x76) {
      fVerbose = fVerbose ^ 1;
    }
    if (iVar1 == -1) break;
    if (iVar1 != 0x66) goto LAB_002554ba;
    fFancy = fFancy ^ 1;
  }
  if (0xfffffffb < (argc - globalUtilOptind) - 6U) {
    memcpy(&local_48,argv + globalUtilOptind,(ulong)(uint)(~globalUtilOptind + argc) * 8 + 8);
    Acb_NtkRunTest(&local_48,fFancy,fVerbose);
    return 0;
  }
  Abc_Print(1,"Expecting two or three file names on the command line.\n");
LAB_002554ba:
  Abc_Print(-2,"usage: runtest [-fvh] <file1> <file2>\n");
  Abc_Print(-2,"\t           experimental simulation command\n");
  pcVar3 = "yes";
  pcVar2 = "yes";
  if (fFancy == 0) {
    pcVar2 = "no";
  }
  Abc_Print(-2,"\t-f       : toggle using experimental feature [default = %s]\n",pcVar2);
  if (fVerbose == 0) {
    pcVar3 = "no";
  }
  Abc_Print(-2,"\t-v       : toggle printing verbose information [default = %s]\n",pcVar3);
  Abc_Print(-2,"\t-h       : print the command usage\n");
  return 1;
}

Assistant:

int Abc_CommandRunTest( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern void Acb_NtkRunTest( char * pFileNames[4], int fFancy, int fVerbose );
    char * pFileNames[4] = {NULL};
    int c, fFancy = 0, fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "fvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'f':
            fFancy ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( argc - globalUtilOptind < 2 || argc - globalUtilOptind > 5 )
    {
        Abc_Print( 1, "Expecting two or three file names on the command line.\n" );
        goto usage;
    }
    for ( c = 0; c < argc - globalUtilOptind; c++ )
        pFileNames[c] = argv[globalUtilOptind+c];
    Acb_NtkRunTest( pFileNames, fFancy, fVerbose );
    return 0;

usage:
    Abc_Print( -2, "usage: runtest [-fvh] <file1> <file2>\n" );
    Abc_Print( -2, "\t           experimental simulation command\n" );
    Abc_Print( -2, "\t-f       : toggle using experimental feature [default = %s]\n",      fFancy? "yes": "no" );
    Abc_Print( -2, "\t-v       : toggle printing verbose information [default = %s]\n",    fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h       : print the command usage\n");
    return 1;
}